

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O2

void __thiscall Gluco::SimpSolver::relocAll(SimpSolver *this,ClauseAllocator *to)

{
  ClauseAllocator *this_00;
  int iVar1;
  int iVar2;
  uint *cr;
  int iVar3;
  int index;
  long lVar4;
  long lVar5;
  vec<unsigned_int> *pvVar6;
  int j;
  long lVar7;
  
  if (this->use_simplification == true) {
    this_00 = &(this->super_Solver).ca;
    for (lVar5 = 0; lVar5 < (this->super_Solver).vardata.sz; lVar5 = lVar5 + 1) {
      pvVar6 = (this->occurs).occs.data + lVar5;
      lVar4 = 0;
      for (lVar7 = 0; lVar7 < pvVar6->sz; lVar7 = lVar7 + 1) {
        ClauseAllocator::reloc(this_00,(CRef *)((long)pvVar6->data + lVar4),to);
        lVar4 = lVar4 + 4;
      }
    }
    index = 0;
    while( true ) {
      iVar1 = (this->subsumption_queue).end;
      iVar3 = 0;
      iVar2 = (this->subsumption_queue).first;
      if (iVar1 < iVar2) {
        iVar3 = (this->subsumption_queue).buf.sz;
      }
      if ((iVar1 - iVar2) + iVar3 <= index) break;
      cr = Queue<unsigned_int>::operator[](&this->subsumption_queue,index);
      ClauseAllocator::reloc(this_00,cr,to);
      index = index + 1;
    }
    ClauseAllocator::reloc(this_00,&this->bwdsub_tmpunit,to);
    return;
  }
  return;
}

Assistant:

void SimpSolver::relocAll(ClauseAllocator& to)
{
    int i;
    if (!use_simplification) return;

    // All occurs lists:
    //
    for (i = 0; i < nVars(); i++){
        vec<CRef>& cs = occurs[i];
        for (int j = 0; j < cs.size(); j++)
            ca.reloc(cs[j], to);
    }

    // Subsumption queue:
    //
    for (i = 0; i < subsumption_queue.size(); i++)
        ca.reloc(subsumption_queue[i], to);

    // Temporary clause:
    //
    ca.reloc(bwdsub_tmpunit, to);
}